

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
 pstore::utf::
 code_point_to_utf8<unsigned_char,std::back_insert_iterator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>
           (char32_t c,
           back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
           out)

{
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  *pbVar1;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_c8;
  byte local_b9;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_b8;
  byte local_a9;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_a8;
  byte local_99;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_98;
  byte local_89;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_88;
  byte local_79;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_78;
  byte local_69;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_68;
  byte local_59;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *local_58;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_48;
  value_type local_39;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_38;
  value_type local_29;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_28;
  value_type local_1d;
  char32_t local_1c;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  bStack_18;
  char32_t c_local;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  out_local;
  
  local_1c = c;
  bStack_18.container = out.container;
  if ((uint)c < 0x80) {
    local_1d = (value_type)c;
    local_28 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator++(&stack0xffffffffffffffe8,0);
    pbVar1 = std::
             back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_28);
    std::
    back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
    ::operator=(pbVar1,&local_1d);
  }
  else if ((uint)c < 0x800) {
    local_29 = (char)((uint)c >> 6) + 0xc0;
    local_38 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator++(&stack0xffffffffffffffe8,0);
    pbVar1 = std::
             back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_38);
    std::
    back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
    ::operator=(pbVar1,&local_29);
    local_39 = ((byte)local_1c & 0x3f) + 0x80;
    local_48 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator++(&stack0xffffffffffffffe8,0);
    pbVar1 = std::
             back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_48);
    std::
    back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
    ::operator=(pbVar1,&local_39);
  }
  else if ((((uint)c < 0xd800) || (0xdfff < (uint)c)) && ((uint)c < 0x110000)) {
    if ((uint)c < 0x10000) {
      local_59 = (byte)((uint)c >> 0xc) | 0xe0;
      local_68 = std::
                 back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                 ::operator++(&stack0xffffffffffffffe8,0);
      pbVar1 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_68);
      std::
      back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
      ::operator=(pbVar1,&local_59);
      local_69 = (byte)((uint)local_1c >> 6) & 0x3f | 0x80;
      local_78 = std::
                 back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                 ::operator++(&stack0xffffffffffffffe8,0);
      pbVar1 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_78);
      std::
      back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
      ::operator=(pbVar1,&local_69);
      local_79 = (byte)local_1c & 0x3f | 0x80;
      local_88 = std::
                 back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                 ::operator++(&stack0xffffffffffffffe8,0);
      pbVar1 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_88);
      std::
      back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
      ::operator=(pbVar1,&local_79);
    }
    else {
      if (0x10ffff < (uint)c) {
        assert_failed("c < 0x110000",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/utf.hpp"
                      ,0xad);
      }
      local_89 = (byte)((uint)c >> 0x12) | 0xf0;
      local_98 = std::
                 back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                 ::operator++(&stack0xffffffffffffffe8,0);
      pbVar1 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_98);
      std::
      back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
      ::operator=(pbVar1,&local_89);
      local_99 = (byte)((uint)local_1c >> 0xc) & 0x3f | 0x80;
      local_a8 = std::
                 back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                 ::operator++(&stack0xffffffffffffffe8,0);
      pbVar1 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_a8);
      std::
      back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
      ::operator=(pbVar1,&local_99);
      local_a9 = (byte)((uint)local_1c >> 6) & 0x3f | 0x80;
      local_b8 = std::
                 back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                 ::operator++(&stack0xffffffffffffffe8,0);
      pbVar1 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_b8);
      std::
      back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
      ::operator=(pbVar1,&local_a9);
      local_b9 = (byte)local_1c & 0x3f | 0x80;
      local_c8 = std::
                 back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                 ::operator++(&stack0xffffffffffffffe8,0);
      pbVar1 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_c8);
      std::
      back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
      ::operator=(pbVar1,&local_b9);
    }
  }
  else {
    local_58 = out.container;
    bStack_18 = replacement_char<unsigned_char,std::back_insert_iterator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>
                          (out);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
          )bStack_18.container;
}

Assistant:

auto code_point_to_utf8 (char32_t const c, OutputIt out) -> OutputIt {
            if (c < 0x80) {
                *(out++) = static_cast<CharType> (c);
            } else if (c < 0x800) {
                *(out++) = static_cast<CharType> (c / 64U + 0xC0U);
                *(out++) = static_cast<CharType> (c % 64U + 0x80U);
            } else if ((c >= 0xD800 && c < 0xE000) || c >= 0x110000) {
                out = replacement_char<CharType> (out);
            } else if (c < 0x10000) {
                *(out++) = static_cast<CharType> ((c / 0x1000U) | 0xE0U);
                *(out++) = static_cast<CharType> ((c / 64U % 64U) | 0x80U);
                *(out++) = static_cast<CharType> ((c % 64U) | 0x80U);
            } else {
                PSTORE_ASSERT (c < 0x110000);
                *(out++) = static_cast<CharType> ((c / 0x40000U) | 0xF0U);
                *(out++) = static_cast<CharType> ((c / 0x1000U % 64U) | 0x80U);
                *(out++) = static_cast<CharType> ((c / 64U % 64U) | 0x80U);
                *(out++) = static_cast<CharType> ((c % 64U) | 0x80U);
            }
            return out;
        }